

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O1

void __thiscall
TEST_WiningStateTest_HeavenlyHand_TestShell::~TEST_WiningStateTest_HeavenlyHand_TestShell
          (TEST_WiningStateTest_HeavenlyHand_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(WiningStateTest, HeavenlyHand)
{
	addNoWiningHand();
		
	SelfDrawnSituation situation;
	situation.is_uninterrupted_first_drawn = true;

	selfDrawn(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::HeavenlyHand));
	CHECK_EQUAL(100, r.doubling_factor);
}